

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O0

Pointer<std::allocator<absl::status_internal::Payload>_> __thiscall
absl::inlined_vector_internal::
Storage<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>::
GetAllocatedData(Storage<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>
                 *this)

{
  Storage<absl::status_internal::Payload,_1UL,_std::allocator<absl::status_internal::Payload>_>
  *this_local;
  
  return (this->data_).allocated.allocated_data;
}

Assistant:

Pointer<A> GetAllocatedData() {
    // GCC 12 has a false-positive -Wmaybe-uninitialized warning here.
#if ABSL_INTERNAL_HAVE_MIN_GNUC_VERSION(12, 0)
#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Wmaybe-uninitialized"
#endif
    return data_.allocated.allocated_data;
#if ABSL_INTERNAL_HAVE_MIN_GNUC_VERSION(12, 0)
#pragma GCC diagnostic pop
#endif
  }